

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O0

bool llava_eval_image_embed
               (llama_context *ctx_llama,llava_image_embed *image_embed,int n_batch,int *n_past)

{
  int iVar1;
  undefined8 uVar2;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  llava_embd_batch llava_batch;
  float *embd;
  int n_eval;
  int i;
  int n_embd;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 in_stack_ffffffffffffff08;
  llama_pos in_stack_ffffffffffffff10;
  int32_t in_stack_ffffffffffffff14;
  float *in_stack_ffffffffffffff18;
  llava_embd_batch *in_stack_ffffffffffffff20;
  undefined8 uStack_70;
  undefined8 local_48;
  int local_34;
  int local_30;
  byte local_1;
  
  uVar2 = llama_get_model(in_RDI);
  llama_model_n_embd(uVar2);
  for (local_30 = 0; local_30 < *(int *)(in_RSI + 8); local_30 = in_EDX + local_30) {
    local_34 = *(int *)(in_RSI + 8) - local_30;
    if (in_EDX < local_34) {
      local_34 = in_EDX;
    }
    llava_embd_batch::llava_embd_batch
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
               in_stack_ffffffffffffff10,(llama_seq_id)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    uStack_120 = (undefined4)uStack_70;
    uStack_11c = (undefined4)((ulong)uStack_70 >> 0x20);
    in_stack_ffffffffffffff08 = local_48;
    iVar1 = llama_decode(in_RDI);
    if (iVar1 == 0) {
      *in_RCX = local_34 + *in_RCX;
    }
    else {
      fprintf(_stderr,"%s : failed to eval\n","llava_eval_image_embed");
      local_1 = 0;
    }
    llava_embd_batch::~llava_embd_batch((llava_embd_batch *)CONCAT44(uStack_11c,uStack_120));
    if (iVar1 != 0) goto LAB_00197106;
  }
  local_1 = 1;
LAB_00197106:
  return (bool)(local_1 & 1);
}

Assistant:

bool llava_eval_image_embed(llama_context * ctx_llama, const struct llava_image_embed * image_embed, int n_batch, int * n_past) {
    int n_embd  = llama_model_n_embd(llama_get_model(ctx_llama));

    for (int i = 0; i < image_embed->n_image_pos; i += n_batch) {
        int n_eval = image_embed->n_image_pos - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        float * embd = image_embed->embed+i*n_embd;
        llava_embd_batch llava_batch = llava_embd_batch(embd, n_eval, *n_past, 0);
        if (llama_decode(ctx_llama, llava_batch.batch)) {
            LOG_ERR("%s : failed to eval\n", __func__);
            return false;
        }
        *n_past += n_eval;
    }
    return true;
}